

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sol.h
# Opt level: O3

void mp::internal::WriteSuffixes<mp::BasicSuffixSet<std::allocator<char>>>
               (BufferedFile *file,BasicSuffixSet<std::allocator<char>_> *suffixes)

{
  _Rb_tree_color *p_Var1;
  uint uVar2;
  _Base_ptr p_Var3;
  char *__s;
  bool bVar4;
  bool bVar5;
  BufferedFile *pBVar6;
  uint uVar7;
  long lVar8;
  size_t sVar9;
  _Base_ptr p_Var10;
  Impl *pIVar11;
  long lVar12;
  _Base_ptr p_Var13;
  uint uVar14;
  _Rb_tree_node_base *p_Var15;
  ulong uVar16;
  uint uVar17;
  uint uVar18;
  anon_union_8_2_de49483c_for_ArgList_1 in_R8;
  SuffixBase SVar19;
  int iVar20;
  difference_type __n;
  ulong uVar21;
  ArgList args;
  ArgList args_00;
  SuffixValueWriter writer;
  IntSuffix int_suffix;
  SuffixValueWriter local_c0;
  BufferedFile *local_b8;
  _Rb_tree_node_base *local_b0;
  Impl *local_a8;
  BasicSuffix<double> local_a0;
  BasicSuffix<int> local_98;
  _Base_ptr p_Stack_90;
  ulong local_88;
  long local_78;
  ulong local_68;
  ulong local_58;
  char *local_48;
  
  if (suffixes != (BasicSuffixSet<std::allocator<char>_> *)0x0) {
    p_Var10 = (suffixes->set_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var15 = &(suffixes->set_)._M_t._M_impl.super__Rb_tree_header._M_header;
    local_b8 = file;
    local_b0 = p_Var15;
    if (p_Var10 != p_Var15) {
      do {
        uVar2 = *(uint *)&p_Var10[1]._M_left;
        if ((uVar2 & 0x10) != 0) {
          local_a8 = (Impl *)(p_Var10 + 1);
          if ((local_a8 == (Impl *)0x0) || ((uVar2 & 4) != 0)) {
            uVar14 = 0;
            pIVar11 = (Impl *)0x0;
            if ((uVar2 & 4) != 0) {
              pIVar11 = local_a8;
            }
            if (0 < (long)pIVar11->num_values) {
              uVar14 = 0;
              lVar8 = 0;
              uVar17 = 0;
              do {
                p_Var1 = &((_Base_ptr)(pIVar11->field_3).values)->_M_color + lVar8 * 2;
                bVar4 = NAN(*(double *)p_Var1);
                bVar5 = *(double *)p_Var1 != 0.0;
                uVar18 = uVar17 + 1;
                if (bVar5) {
                  uVar14 = uVar18;
                }
                if (bVar4) {
                  uVar14 = uVar18;
                }
                if (bVar5) {
                  uVar17 = uVar18;
                }
                if (bVar4) {
                  uVar17 = uVar18;
                }
                lVar8 = lVar8 + 1;
              } while (pIVar11->num_values != lVar8);
            }
          }
          else {
            lVar8 = (long)*(int *)((long)&p_Var10[1]._M_left + 4);
            if (lVar8 < 1) {
              uVar14 = 0;
            }
            else {
              uVar14 = 0;
              lVar12 = 0;
              uVar17 = 0;
              do {
                uVar18 = uVar17 + 1;
                uVar7 = uVar17 + 1;
                if ((&(p_Var10[1]._M_right)->_M_color)[lVar12] == _S_red) {
                  uVar18 = uVar17;
                  uVar7 = uVar14;
                }
                uVar14 = uVar7;
                uVar17 = uVar18;
                lVar12 = lVar12 + 1;
              } while (lVar8 != lVar12);
            }
          }
          p_Var3 = p_Var10[2]._M_parent;
          if (p_Var3 == (_Base_ptr)0x0) {
            uVar16 = 0;
            uVar21 = 0;
          }
          else {
            p_Var13 = (_Base_ptr)0x0;
            iVar20 = 0;
            do {
              iVar20 = iVar20 + (uint)(*(char *)((long)&p_Var13->_M_color + *(long *)(p_Var10 + 2))
                                      == '\n');
              p_Var13 = (_Base_ptr)((long)&p_Var13->_M_color + 1);
            } while (p_Var3 != p_Var13);
            uVar16 = (ulong)((int)p_Var3 + 1);
            uVar21 = (ulong)(iVar20 + 1);
          }
          __s = *(char **)(p_Var10 + 1);
          SVar19.impl_._0_4_ = uVar2 & 0xf;
          SVar19.impl_._4_4_ = 0;
          sVar9 = strlen(__s);
          pBVar6 = local_b8;
          local_78 = sVar9 + 1;
          local_88 = (ulong)uVar14;
          args.field_1.values_ = in_R8.values_;
          args.types_ = (uint64_t)&local_98;
          local_98.super_SuffixBase.impl_ = (SuffixBase)(SuffixBase)SVar19.impl_;
          local_68 = uVar16;
          local_58 = uVar21;
          local_48 = __s;
          fmt::print((fmt *)local_b8->file_,(FILE *)"suffix {} {} {} {} {}\n{}\n",
                     (CStringRef)0xa22522,args);
          if ((int)uVar16 != 0) {
            local_98.super_SuffixBase.impl_ = *(SuffixBase *)(p_Var10 + 2);
            p_Stack_90 = p_Var10[2]._M_parent;
            args_00.field_1.values_ = in_R8.values_;
            args_00.types_ = (uint64_t)&local_98;
            fmt::print((fmt *)pBVar6->file_,(FILE *)0x229bdd,(CStringRef)0xb,args_00);
          }
          p_Var15 = local_b0;
          local_c0.file_ = pBVar6;
          local_98.super_SuffixBase.impl_ = (SuffixBase)(SuffixBase)(Impl *)0x0;
          if (((ulong)p_Var10[1]._M_left & 4) == 0) {
            local_98.super_SuffixBase.impl_ = (SuffixBase)(SuffixBase)local_a8;
          }
          if (local_98.super_SuffixBase.impl_ == (Impl *)0x0) {
            local_a0.super_SuffixBase.impl_ = (SuffixBase)(SuffixBase)local_a8;
            if (((ulong)p_Var10[1]._M_left & 4) == 0) {
              local_a0.super_SuffixBase.impl_ = (SuffixBase)(Impl *)0x0;
            }
            BasicSuffix<double>::VisitValues<mp::internal::SuffixValueWriter>(&local_a0,&local_c0);
          }
          else {
            BasicSuffix<int>::VisitValues<mp::internal::SuffixValueWriter>(&local_98,&local_c0);
          }
        }
        p_Var10 = (_Base_ptr)std::_Rb_tree_increment(p_Var10);
      } while (p_Var10 != p_Var15);
    }
  }
  return;
}

Assistant:

void WriteSuffixes(fmt::BufferedFile &file, const SuffixMap *suffixes) {
  if (!suffixes)
    return;
  for (typename SuffixMap::iterator
       i = suffixes->begin(), e = suffixes->end(); i != e; ++i) {
    if ((i->kind() & suf::OUTPUT) == 0)
      continue;
    SuffixValueCounter counter;
    i->VisitValues(counter);
    int num_values = counter.num_values();
    const char *name = i->name();
    int mask = internal::SUFFIX_KIND_MASK | suf::FLOAT | suf::IODECL;
    const auto& table = i->table();
    int tablen = table.size() ? table.size()+1 : 0;
    int tabNlines = table.empty()? 0 :
                                   1+std::count(table.begin(), table.end(), '\n');
    file.print("suffix {} {} {} {} {}\n{}\n",
               i->kind() & mask, num_values, std::strlen(name) + 1,
               tablen, tabNlines, name);
    if (tablen)
      file.print("{}\n", table);
    SuffixValueWriter writer(file);
    i->VisitValues(writer);
  }
}